

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ObjectValues *pOVar3;
  iterator __pos;
  _Base_ptr p_Var4;
  CZString key;
  value_type defaultValue;
  undefined1 local_1b8 [32];
  ValueHolder local_198;
  uint local_190;
  ValueHolder local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  
  if (*(char *)&this->bits_ == '\0') {
    local_190 = CONCAT22(local_190._2_2_,6);
    local_188.int_ = 0;
    uStack_180 = 0;
    local_178 = 0;
    local_198.string_ = (char *)operator_new(0x30);
    p_Var1 = &((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(char *)((long)local_198 + 0) = '\0';
    *(char *)((long)local_198 + 1) = '\0';
    *(char *)((long)local_198 + 2) = '\0';
    *(char *)((long)local_198 + 3) = '\0';
    *(char *)((long)local_198 + 4) = '\0';
    *(char *)((long)local_198 + 5) = '\0';
    *(char *)((long)local_198 + 6) = '\0';
    *(char *)((long)local_198 + 7) = '\0';
    *(undefined8 *)&((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    swap((Value *)&local_198,this);
    ~Value((Value *)&local_198);
  }
  else if (*(char *)&this->bits_ != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198.bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.bool_,
               "in Json::Value::operator[](ArrayIndex): requires arrayValue",0x3b);
    std::__cxx11::stringbuf::str();
    throwLogicError((String *)local_1b8);
  }
  local_1b8._0_8_ = (pointer)0x0;
  pOVar3 = (this->value_).map_;
  p_Var4 = (pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  __pos._M_node = &(pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_1b8._8_4_ = index;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      bVar2 = CZString::operator<((CZString *)(p_Var4 + 1),(CZString *)local_1b8);
      if (!bVar2) {
        __pos._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    pOVar3 = (this->value_).map_;
  }
  if (((_Rb_tree_header *)__pos._M_node == &(pOVar3->_M_t)._M_impl.super__Rb_tree_header) ||
     (bVar2 = CZString::operator==((CZString *)(__pos._M_node + 1),(CZString *)local_1b8), !bVar2))
  {
    nullSingleton();
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)&local_198,(CZString *)local_1b8,
               &nullSingleton::nullStatic);
    __pos = std::
            _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
            ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                      ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                        *)(this->value_).map_,__pos._M_node,
                       (pair<const_Json::Value::CZString,_Json::Value> *)&local_198);
    ~Value((Value *)&local_188);
    if ((local_198 != (undefined8 *)0x0) && ((local_190 & 3) == 1)) {
      free(local_198.string_);
    }
    if (((pointer)local_1b8._0_8_ != (pointer)0x0) && ((local_1b8._8_4_ & 3) == 1)) {
      free((void *)local_1b8._0_8_);
    }
  }
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  CZString key(index);
  auto it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
}